

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

DeduplicateStatus __thiscall
cmCPackArchiveGenerator::Deduplicator::IsDeduplicate
          (Deduplicator *this,string *path,string *localTopLevel)

{
  bool bVar1;
  DeduplicateStatus DVar2;
  
  bVar1 = cmsys::SystemTools::FileIsDirectory(path);
  if (bVar1) {
    DVar2 = CompareFolder(this,path);
    return DVar2;
  }
  bVar1 = cmsys::SystemTools::FileIsSymlink(path);
  if (bVar1) {
    DVar2 = CompareSymlink(this,path);
    return DVar2;
  }
  DVar2 = CompareFile(this,path,localTopLevel);
  return DVar2;
}

Assistant:

DeduplicateStatus IsDeduplicate(const std::string& path,
                                  const std::string& localTopLevel)
  {
    DeduplicateStatus status;
    if (cmSystemTools::FileIsDirectory(path)) {
      status = this->CompareFolder(path);
    } else if (cmSystemTools::FileIsSymlink(path)) {
      status = this->CompareSymlink(path);
    } else {
      status = this->CompareFile(path, localTopLevel);
    }

    return status;
  }